

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void free_fake_bb_insns(VARR_bb_insn_t *bb_insns)

{
  size_t sVar1;
  bb_insn_t_conflict __ptr;
  
  if (bb_insns != (VARR_bb_insn_t *)0x0) {
    while( true ) {
      sVar1 = bb_insns->els_num;
      if (sVar1 == 0) {
        return;
      }
      if (bb_insns->varr == (bb_insn_t_conflict *)0x0) break;
      bb_insns->els_num = sVar1 - 1;
      __ptr = bb_insns->varr[sVar1 - 1];
      if (__ptr != (bb_insn_t_conflict)0x0) {
        remove_insn_ssa_edges(__ptr->insn);
        free(__ptr->insn);
        free(__ptr);
      }
    }
    free_fake_bb_insns_cold_1();
  }
  free_fake_bb_insns_cold_2();
  return;
}

Assistant:

static void free_fake_bb_insns (VARR (bb_insn_t) * bb_insns) {
  bb_insn_t bb_insn;

  while (VARR_LENGTH (bb_insn_t, bb_insns) != 0)
    if ((bb_insn = VARR_POP (bb_insn_t, bb_insns)) != NULL) {  // ??? specialized free funcs
      remove_insn_ssa_edges (bb_insn->insn);
      free (bb_insn->insn); /* we can not use gen_delete as the insn not in the list */
      free (bb_insn);
    }
}